

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O1

error<idx2::mmap_err_code> idx2::OpenFile(mmap_file *MMap,cstr Name,map_mode Mode)

{
  int *piVar1;
  int iVar2;
  name_map *pnVar3;
  undefined8 uVar4;
  mmap_err_code mVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long *in_FS_OFFSET;
  error<idx2::mmap_err_code> eVar9;
  
  iVar2 = 0x242;
  if (Mode == Read) {
    iVar2 = 0;
  }
  iVar2 = open(Name,iVar2,0x180);
  MMap->File = iVar2;
  if (iVar2 == -1) {
    *(char **)(*in_FS_OFFSET + -0x480) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x280) = 0x1a;
    pnVar3 = &mmap_err_code_s::NameMap;
    mVar5 = mmap_err_code_s::NameMap.Arr[0].ItemVal;
    if (mmap_err_code_s::NameMap.Arr[0].ItemVal != FileCreateFailed) {
      lVar7 = 0x28;
      do {
        if (lVar7 == 0x298) {
          mVar5 = __Invalid__;
          goto LAB_0019d1a9;
        }
        piVar1 = (int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar7);
        lVar7 = lVar7 + 0x18;
      } while (*piVar1 != 10);
      mVar5 = FileCreateFailed;
    }
LAB_0019d1a9:
    if (mmap_err_code_s::NameMap.Arr[0].ItemVal != mVar5) {
      lVar7 = 0;
      do {
        lVar6 = lVar7;
        if (lVar6 == 0x270) {
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.h"
                        ,0x28,"stref idx2::ToString(mmap_err_code)");
        }
        lVar7 = lVar6 + 0x18;
      } while (*(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[1].ItemVal + lVar6) != mVar5);
      pnVar3 = (name_map *)((long)&mmap_err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
    }
    lVar7 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar7 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)pnVar3->Arr[0].Name.Size,pnVar3->Arr[0].Name.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
                     ,0x1a);
    pcVar8 = "file: %s\n";
    snprintf((char *)(lVar7 + -0xc80) + iVar2,0x400 - (long)iVar2,"file: %s\n",Name);
    uVar4 = 0x1000000000a;
  }
  else {
    MMap->Mode = Mode;
    *(char **)(*in_FS_OFFSET + -0x480) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x280) = 0x1d;
    pcVar8 = "";
    uVar4 = 0;
  }
  eVar9.Code = (int)uVar4;
  eVar9.StackIdx = (char)((ulong)uVar4 >> 0x20);
  eVar9.StrGened = (bool)(char)((ulong)uVar4 >> 0x28);
  eVar9._14_2_ = (short)((ulong)uVar4 >> 0x30);
  eVar9.Msg = pcVar8;
  return eVar9;
}

Assistant:

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode)
{
#if defined(_WIN32)
  MMap->File = CreateFileA(Name,
                           Mode == map_mode::Read ? GENERIC_READ : GENERIC_READ | GENERIC_WRITE,
                           0,
                           NULL,
                           OPEN_ALWAYS,
                           FILE_ATTRIBUTE_NORMAL,
                           NULL);
  if (MMap->File == INVALID_HANDLE_VALUE)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  MMap->File = open(Name, Mode == map_mode::Read ? O_RDONLY : O_RDWR | O_CREAT | O_TRUNC, 0600);
  if (MMap->File == -1)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#endif
  MMap->Mode = Mode;
  return idx2_Error(mmap_err_code::NoError);
}